

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalcontainer.cpp
# Opt level: O3

void __thiscall
hbm::streaming::SignalContainer::processMetaInformation
          (SignalContainer *this,uint signalNumber,string *method,Value *params)

{
  int iVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false> _Var2;
  SubscribedSignal *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false,_false>,_bool>
  pVar3;
  uint local_4ac;
  SubscribedSignal local_4a8;
  
  local_4ac = signalNumber;
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_4ac);
  iVar1 = std::__cxx11::string::compare((char *)method);
  if (iVar1 == 0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_std::allocator<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,&local_4ac);
  }
  else {
    if (_Var2._M_cur == (__node_type *)0x0) {
      SubscribedSignal::SubscribedSignal(&local_4a8,local_4ac);
      pVar3 = std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,hbm::streaming::SubscribedSignal>,std::allocator<std::pair<unsigned_int_const,hbm::streaming::SubscribedSignal>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_int&,hbm::streaming::SubscribedSignal>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,hbm::streaming::SubscribedSignal>,std::allocator<std::pair<unsigned_int_const,hbm::streaming::SubscribedSignal>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this,&local_4ac,&local_4a8);
      _Var2._M_cur = (__node_type *)
                     pVar3.first.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
                     ._M_cur;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8.m_signalReference._M_dataplus._M_p != &local_4a8.m_signalReference.field_2) {
        operator_delete(local_4a8.m_signalReference._M_dataplus._M_p);
      }
    }
    this_00 = (SubscribedSignal *)
              ((long)&((_Var2._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_hbm::streaming::SubscribedSignal>_>
                      ._M_storage._M_storage + 8);
    SubscribedSignal::processSignalMetaInformation(this_00,method,params);
    if ((this->m_signalMetaCb).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_signalMetaCb)._M_invoker)((_Any_data *)&this->m_signalMetaCb,this_00,method,params)
      ;
    }
  }
  return;
}

Assistant:

void SignalContainer::processMetaInformation(unsigned int signalNumber, const std::string& method, const Json::Value& params)
		{
			signals_t::iterator iter = m_subscribedsignals.find(signalNumber);

			if(method=="unsubscribe") {
				m_subscribedsignals.erase(signalNumber);
				return;
			}

			if (iter == m_subscribedsignals.end()) {
#ifdef _MSC_VER
				std::pair < signals_t::iterator, bool > result = m_subscribedsignals.insert(std::make_pair(signalNumber, SubscribedSignal(signalNumber)));
#else
				std::pair < signals_t::iterator, bool > result = m_subscribedsignals.emplace(signalNumber, SubscribedSignal(signalNumber));
#endif
				iter = result.first;
			}

			SubscribedSignal& signal = iter->second;
			signal.processSignalMetaInformation(method, params);
			if (m_signalMetaCb) {
				m_signalMetaCb(signal, method, params);
			}
		}